

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextItem(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  uint in_ESI;
  ImGuiWindow *in_RDI;
  ImGuiID unaff_retaddr;
  int mouse_button;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPopupFlags in_stack_00000020;
  ImGuiHoveredFlags flags;
  ImGuiContext *pIVar2;
  undefined4 in_stack_ffffffffffffffe8;
  ImGuiWindowFlags in_stack_fffffffffffffffc;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    pIVar2 = GImGui;
    if (in_RDI != (ImGuiWindow *)0x0) {
      ImGuiWindow::GetID(in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         &GImGui->Initialized);
    }
    flags = (ImGuiHoveredFlags)pIVar2;
    bVar1 = IsMouseReleased(in_ESI & 0x1f);
    if ((bVar1) && (bVar1 = IsItemHovered(flags), bVar1)) {
      OpenPopupEx(popup_flags,in_stack_00000020);
    }
    bVar1 = BeginPopupEx(unaff_retaddr,in_stack_fffffffffffffffc);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : g.LastItemData.ID;    // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                             // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}